

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate
          (DrawElementsBaseVertexNegativeInvalidTypeArgumentTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ostream *poVar5;
  TestError *pTVar6;
  uint uVar7;
  char *local_368 [4];
  GLsizei count;
  GLvoid *offsets [1];
  undefined1 local_338 [384];
  stringstream error_sstream;
  ostream local_1a8;
  long lVar4;
  
  iVar2 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar7 = 0;
  do {
    if (uVar7 == 4) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    uVar3 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar7 == 0) || ((uVar3 & 0x300) == 0)) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,1 < uVar7,(bool)((byte)uVar7 & 1));
      (**(code **)(lVar4 + 0x570))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar5 = std::operator<<(&local_1a8,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        poVar5 = std::operator<<(poVar5,(string *)local_338);
        std::operator<<(poVar5," call");
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_368[0]);
        std::operator<<((ostream *)poVar1,": expected GL_INVALID_ENUM, got:[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar6,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xc8a);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x5a8))
                (4,0,2,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar5 = std::operator<<(&local_1a8,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        poVar5 = std::operator<<(poVar5,(string *)local_338);
        std::operator<<(poVar5," call");
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_368[0]);
        std::operator<<((ostream *)poVar1,": expected GL_INVALID_ENUM, got:[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar6,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xca0);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x590))
                (4,3,0,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,1,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x500) {
        std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
        poVar5 = std::operator<<(&local_1a8,"Invalid error code reported for an invalid ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        poVar5 = std::operator<<(poVar5,(string *)local_338);
        std::operator<<(poVar5," call");
        std::__cxx11::string::~string((string *)local_338);
        local_338._0_8_ =
             ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_368[0]);
        std::operator<<((ostream *)poVar1,": expected GL_INVALID_ENUM, got:[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar6,(char *)local_338._0_8_,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xcb5);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported == true)
      {
        count = 3;
        offsets[0] = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
        (**(code **)(lVar4 + 0xde8))(4,&count,0,offsets,1,0);
        iVar2 = (**(code **)(lVar4 + 0x800))();
        if (iVar2 != 0x500) {
          std::__cxx11::stringstream::stringstream((stringstream *)&error_sstream);
          poVar5 = std::operator<<(&local_1a8,"Invalid error code reported for an invalid ");
          DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                    ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                     FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX);
          poVar5 = std::operator<<(poVar5,(string *)local_338);
          std::operator<<(poVar5," call");
          std::__cxx11::string::~string((string *)local_338);
          local_338._0_8_ =
               ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_338 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)poVar1,local_368[0]);
          std::operator<<((ostream *)poVar1,": expected GL_INVALID_ENUM, got:[");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1,"]");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)local_368);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          tcu::TestError::TestError
                    (pTVar6,(char *)local_338._0_8_,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                     ,0xcce);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Try to execute the invalid draw calls */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES,												 /* mode */
								  3,														 /* count */
								  GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES,											  /* mode */
									   0,														  /* start */
									   2,														  /* end */
									   3,														  /* count */
									   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES,											 /* mode */
										   3,														 /* count */
										   GL_NONE, (const glw::GLvoid*)m_draw_call_index_offset, 1, /* instancecount */
										   0);														 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_ENUM)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code reported for an invalid "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX) << " call";

			m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
							   << ": expected GL_INVALID_ENUM, got:"
								  "["
							   << error_code << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		if (m_is_ext_multi_draw_arrays_supported)
		{
			const glw::GLsizei count	 = 3;
			const glw::GLvoid* offsets[] = { (const glw::GLvoid*)m_draw_call_index_offset };

			gl.multiDrawElementsBaseVertex(GL_TRIANGLES,				/* mode */
										   &count, GL_NONE, offsets, 1, /* primcount */
										   0);							/* basevertex */

			error_code = gl.getError();
			if (error_code != GL_INVALID_ENUM)
			{
				std::stringstream error_sstream;

				error_sstream << "Invalid error code reported for an invalid "
							  << getFunctionName(FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX) << " call";

				m_testCtx.getLog() << tcu::TestLog::Message << error_sstream.str().c_str()
								   << ": expected GL_INVALID_ENUM, got:"
									  "["
								   << error_code << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL(error_sstream.str().c_str());
			}
		} /* if (m_is_ext_multi_draw_arrays_supported) */
	}	 /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}